

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O1

void api_suite::api_ctor_initializer_list(void)

{
  circular_array<int,_4UL> data;
  undefined8 local_58;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_38 = &local_48;
  local_48 = 0x160000000b;
  local_40 = 0;
  local_30 = 2;
  local_28 = 2;
  local_58 = 2;
  local_4c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x47,"void api_suite::api_ctor_initializer_list()",&local_58,&local_4c);
  local_58 = 4;
  local_4c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x48,"void api_suite::api_ctor_initializer_list()",&local_58,&local_4c);
  return;
}

Assistant:

void api_ctor_initializer_list()
{
    circular_array<int, 4> data({11, 22});
    BOOST_TEST_EQ(data.size(), 2);
    BOOST_TEST_EQ(data.capacity(), 4);
}